

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O2

void __thiscall
ExprWriterTest_CountExprPrecedence_Test::TestBody(ExprWriterTest_CountExprPrecedence_Test *this)

{
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *args_00;
  char *message;
  AssertHelper local_80;
  AssertionResult gtest_ar;
  string local_68;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> local_48;
  LogicalExpr args [2];
  
  args[0].super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                 ((BasicExprFactory<std::allocator<char>> *)
                  &(this->super_ExprWriterTest).super_ExprFactory,FIRST_BINARY_LOGICAL,
                  (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                  (this->super_ExprWriterTest).l0.
                  super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_,
                  (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                  (this->super_ExprWriterTest).l1.
                  super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_);
  args_00 = (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)args;
  local_48.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.size_ = 2;
  local_48.data_ = (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)args_00;
  args[1].super_ExprBase.impl_ = args[0].super_ExprBase.impl_;
  local_80.data_ =
       (AssertHelperData *)ExprWriterTest::MakeCount(&this->super_ExprWriterTest,&local_48);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_68,(fmt *)0x14e4d3,(CStringRef)&local_80,args_00);
  testing::internal::CmpHelperEQ<char[22],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"count(0 || 1, 0 || 1)\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeCount(args)))",
             (char (*) [22])"count(0 || 1, 0 || 1)",&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::
  _Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ::~_Vector_base((_Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                   *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x251,message);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ExprWriterTest, CountExprPrecedence) {
  auto e = MakeBinaryLogical(ex::OR, l0, l1);
  LogicalExpr args[] = {e, e};
  CHECK_WRITE("count(0 || 1, 0 || 1)", MakeCount(args));
}